

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::OneofOptions::OneofOptions(OneofOptions *this)

{
  undefined8 *in_RDI;
  ExtensionSet *in_stack_00000020;
  Arena *in_stack_ffffffffffffffb8;
  Message *in_stack_ffffffffffffffc0;
  
  Message::Message(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__OneofOptions_00958c30;
  internal::ExtensionSet::ExtensionSet(in_stack_00000020);
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)(in_RDI + 4),in_stack_ffffffffffffffb8);
  memset(in_RDI + 5,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x51d447);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::UninterpretedOption> *)0x51d459);
  SharedCtor((OneofOptions *)0x51d465);
  return;
}

Assistant:

OneofOptions::OneofOptions()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.OneofOptions)
}